

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O1

void __thiscall
GdlSlotRefExpression::LookupExpCheck(GdlSlotRefExpression *this,bool param_1,Symbol psymFeature)

{
  string local_38;
  
  if (psymFeature != (Symbol)0x0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Setting feature to a slot reference","");
    GrcErrorList::AddError(&g_errorList,0x876,(GdlObject *)&this->field_0x8,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void GdlSlotRefExpression::LookupExpCheck(bool /*fInIf*/, Symbol psymFeature)
{
	if (psymFeature)
	{
		g_errorList.AddError(2166, this,
			"Setting feature to a slot reference");
	}
}